

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O3

void __thiscall Executor::callValue(Executor *this,CallNode *node,string *name,Value *value)

{
  unsigned_long __val;
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Value *pVVar2;
  undefined **ppuVar3;
  Executor *pEVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  RuntimeVariableSymbol *this_01;
  long *plVar6;
  int __flags;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_00;
  size_type *psVar7;
  deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
  *pdVar8;
  void *__child_stack;
  void *__child_stack_00;
  _Alloc_hider _Var9;
  Context *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> argName;
  TypeName type;
  Context newContext;
  FunctionValueAnalyser valueAnalyser;
  string local_438;
  undefined8 *local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  undefined **local_3d0;
  Executor *local_3c8;
  __shared_ptr<RuntimeSymbol,(__gnu_cxx::_Lock_policy)2> local_3c0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  Context local_390;
  string local_340;
  string local_320;
  undefined **local_300;
  undefined1 local_2f8;
  int local_2f4;
  char local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  long *local_2c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_2c0;
  deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
  local_2b8;
  char local_268;
  undefined1 local_260 [16];
  deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
  local_250;
  deque<std::unique_ptr<Value,_std::default_delete<Value>_>,_std::allocator<std::unique_ptr<Value,_std::default_delete<Value>_>_>_>
  local_200;
  ostringstream local_1b0 [112];
  ios_base local_140 [272];
  
  local_300 = &PTR__FunctionValueAnalyser_00150d20;
  local_2f8 = 0;
  local_2f0 = '\0';
  local_2e8.field_2._M_local_buf[8] = '\0';
  local_2c8 = (long *)0x0;
  p_Stack_2c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_268 = '\0';
  (*value->_vptr_Value[3])(value);
  __flags = (int)value;
  iVar5 = (*(node->super_ExpressionNode).super_Node._vptr_Node[3])(node);
  __val = *(unsigned_long *)(CONCAT44(extraout_var,iVar5) + 0x10);
  if (local_2e8.field_2._M_allocated_capacity != __val) {
    std::operator+(&local_3b0,"Function ",name);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_3b0);
    local_410._M_dataplus._M_p = (pointer)*plVar6;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_410._M_dataplus._M_p == psVar7) {
      local_410.field_2._M_allocated_capacity = *psVar7;
      local_410.field_2._8_8_ = plVar6[3];
      local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
    }
    else {
      local_410.field_2._M_allocated_capacity = *psVar7;
    }
    local_410._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::to_string(&local_320,local_2e8.field_2._M_allocated_capacity);
    std::operator+(&local_3f0,&local_410,&local_320);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_3f0);
    local_438._M_dataplus._M_p = (pointer)*plVar6;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_438._M_dataplus._M_p == psVar7) {
      local_438.field_2._M_allocated_capacity = *psVar7;
      local_438.field_2._8_8_ = plVar6[3];
      local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
    }
    else {
      local_438.field_2._M_allocated_capacity = *psVar7;
    }
    local_438._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::to_string(&local_340,__val);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_390,
                   &local_438,&local_340);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_390);
    local_260._0_8_ = *plVar6;
    pdVar8 = (deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
              *)(plVar6 + 2);
    if ((deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
         *)local_260._0_8_ == pdVar8) {
      local_250.
      super__Deque_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map =
           (pdVar8->
           super__Deque_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
           )._M_impl.super__Deque_impl_data._M_map;
      local_250.
      super__Deque_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size = plVar6[3];
      local_260._0_8_ = &local_250;
    }
    else {
      local_250.
      super__Deque_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map =
           (pdVar8->
           super__Deque_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
           )._M_impl.super__Deque_impl_data._M_map;
    }
    local_260._8_8_ = ((__uniq_ptr_impl<Value,_std::default_delete<Value>_> *)(plVar6 + 1))->_M_t;
    *plVar6 = (long)pdVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    reportError((string *)local_260,(Node *)node);
  }
  Context::clone(&local_390,(__fn *)&local_2b8,__child_stack,__flags,in_R8);
  Context::enterScope(&local_390);
  local_3c8 = this;
  iVar5 = (*(node->super_ExpressionNode).super_Node._vptr_Node[3])(node);
  local_3d0 = &PTR__FunctionValueAnalyser_00150d20;
  if (local_2e8.field_2._M_local_buf[8] != '\0') {
    value_00 = &local_2e8;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_2e8._M_dataplus._M_p != value_00) {
      local_418 = *(undefined8 **)CONCAT44(extraout_var_00,iVar5);
      _Var9._M_p = local_2e8._M_dataplus._M_p;
      do {
        local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
        iVar5 = (int)value_00;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_438,
                   (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var9._M_p
                    )->field_2)._M_allocated_capacity,
                   *(long *)((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)_Var9._M_p)->field_2 + 8) +
                   (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var9._M_p
                    )->field_2)._M_allocated_capacity);
        local_3b0._M_dataplus._M_p._0_4_ =
             *(undefined4 *)
              &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)_Var9._M_p + 0x20))->field_2;
        pcVar1 = (pointer)local_418[2];
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_418[3];
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        Context::clone((Context *)local_260,(__fn *)&local_390,__child_stack_00,iVar5,in_R8);
        this_01 = (RuntimeVariableSymbol *)operator_new(0x90);
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        value_00 = &local_3f0;
        in_R8 = (Context *)local_260;
        local_3f0._M_dataplus._M_p = pcVar1;
        local_3f0._M_string_length = (size_type)this_00;
        RuntimeVariableSymbol::RuntimeVariableSymbol
                  (this_01,&local_438,(TypeName *)&local_3b0,(shared_ptr<ExpressionNode> *)value_00,
                   in_R8);
        local_410._M_dataplus._M_p = (pointer)this_01;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f0._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f0._M_string_length);
        }
        std::
        deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
        ::~deque((deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
                  *)local_260);
        std::__shared_ptr<RuntimeSymbol,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<RuntimeVariableSymbol,std::default_delete<RuntimeVariableSymbol>,void>
                  (local_3c0,
                   (unique_ptr<RuntimeVariableSymbol,_std::default_delete<RuntimeVariableSymbol>_> *
                   )&local_410);
        Context::addSymbol(&local_390,&local_438,(shared_ptr<RuntimeSymbol> *)local_3c0);
        if (local_3b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b8);
        }
        local_418 = (undefined8 *)*local_418;
        if ((RuntimeVariableSymbol *)local_410._M_dataplus._M_p != (RuntimeVariableSymbol *)0x0) {
          (**(code **)(*(long *)local_410._M_dataplus._M_p + 8))();
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
        }
        _Var9._M_p = (pointer)((__shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2> *)
                              &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )_Var9._M_p)->_M_dataplus)->_M_ptr;
      } while ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var9._M_p !=
               &local_2e8);
    }
    Executor((Executor *)local_260,&local_390);
    (**(code **)(*local_2c8 + 0x10))(local_2c8,local_260);
    pEVar4 = local_3c8;
    ppuVar3 = local_3d0;
    Context::leaveScope(&local_390);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pEVar4->stdout_,local_438._M_dataplus._M_p,local_438._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((local_2f0 != '\x01') || (local_2f4 != 2)) {
      (**(code **)(*(long *)local_260._8_8_ + 0x10))(&local_438);
      _Var9._M_p = local_438._M_dataplus._M_p;
      local_438._M_dataplus._M_p = (pointer)0x0;
      pVVar2 = (pEVar4->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
               super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
               super__Head_base<0UL,_Value_*,_false>._M_head_impl;
      (pEVar4->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
      super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
      super__Head_base<0UL,_Value_*,_false>._M_head_impl = (Value *)_Var9._M_p;
      if (pVVar2 != (Value *)0x0) {
        (*pVVar2->_vptr_Value[1])();
        if ((Value *)local_438._M_dataplus._M_p != (Value *)0x0) {
          (**(code **)(*(size_type *)local_438._M_dataplus._M_p + 8))();
        }
      }
    }
    local_260._0_8_ = &PTR__Executor_00150380;
    std::__cxx11::ostringstream::~ostringstream(local_1b0);
    std::ios_base::~ios_base(local_140);
    std::
    deque<std::unique_ptr<Value,_std::default_delete<Value>_>,_std::allocator<std::unique_ptr<Value,_std::default_delete<Value>_>_>_>
    ::~deque(&local_200);
    std::
    deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
    ::~deque(&local_250);
    if ((tuple<Value_*,_std::default_delete<Value>_>)local_260._8_8_ !=
        (_Head_base<0UL,_Value_*,_false>)0x0) {
      (**(code **)(*(long *)local_260._8_8_ + 8))();
    }
    std::
    deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
    ::~deque(&local_390.scopes_);
    local_300 = ppuVar3;
    if (local_268 == '\x01') {
      local_268 = '\0';
      std::
      deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
      ::~deque(&local_2b8);
    }
    if (p_Stack_2c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_2c0);
    }
    if (local_2e8.field_2._M_local_buf[8] == '\x01') {
      local_2e8.field_2._M_local_buf[8] = '\0';
      std::__cxx11::
      _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
      ::_M_clear((_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
                  *)&local_2e8);
    }
    return;
  }
  std::__throw_bad_optional_access();
}

Assistant:

void Executor::callValue(const CallNode& node, const std::string& name, const Value& value)
{
  auto valueAnalyser = FunctionValueAnalyser{};
  value.accept(valueAnalyser);

  const auto nExpectedArgs = valueAnalyser.getArguments()->size();
  const auto nProvidedArgs = node.getArguments().size();
  if(nExpectedArgs != nProvidedArgs)
    reportError("Function " + name + " expected " +
                std::to_string(nExpectedArgs) + ", but got " + std::to_string(nProvidedArgs) + " arguments!", node);

  Context newContext = valueAnalyser.getContext()->clone();

  newContext.enterScope();

  auto it = node.getArguments().begin();
  for (const auto &arg : valueAnalyser.getArguments().value())
  {
    const auto argName = arg.first;
    const auto type = arg.second;
    std::shared_ptr<ExpressionNode> argValue = *it;
    auto argSymbol = std::make_unique<RuntimeVariableSymbol>(argName, type, argValue, newContext.clone());
    newContext.addSymbol(argName, std::move(argSymbol));

    ++it;
  }

  Executor functionExecutor{newContext};
  valueAnalyser.getBody()->accept(functionExecutor);

  newContext.leaveScope();

  stdout_ << functionExecutor.getStandardOut();
  if (valueAnalyser.getReturnType() != TypeName::Void)
  {
    value_ = functionExecutor.getValue()->clone();
  }
}